

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinproc.c
# Opt level: O3

void nn_sinproc_accept(nn_sinproc *self,nn_sinproc *peer)

{
  if (self->peer == (nn_sinproc *)0x0) {
    self->peer = peer;
    nn_fsm_raiseto(&self->fsm,&peer->fsm,&self->event_connect,0x6c41,2,self);
    nn_fsm_start(&self->fsm);
    nn_fsm_action(&self->fsm,1);
    return;
  }
  nn_sinproc_accept_cold_1();
}

Assistant:

void nn_sinproc_accept (struct nn_sinproc *self, struct nn_sinproc *peer)
{
    nn_assert (!self->peer);
    self->peer = peer;

    /*  Start the connecting handshake with the peer. */
    nn_fsm_raiseto (&self->fsm, &peer->fsm, &self->event_connect,
        NN_SINPROC_SRC_PEER, NN_SINPROC_READY, self);

    /*  Notify the state machine. */
    nn_fsm_start (&self->fsm);
    nn_fsm_action (&self->fsm, NN_SINPROC_ACTION_READY);
}